

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

h2o_iovec_t log_priority_actual(h2o_req_t *req)

{
  h2o_http2_conn_t *conn_00;
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  char *__s;
  h2o_iovec_t hVar4;
  size_t len;
  char *s;
  h2o_http2_stream_t *stream;
  h2o_http2_conn_t *conn;
  h2o_req_t *req_local;
  
  conn_00 = (h2o_http2_conn_t *)req->conn;
  __s = (char *)h2o_mem_alloc_pool(&req->pool,0x11);
  uVar2 = get_parent_stream_id(conn_00,(h2o_http2_stream_t *)&req[-1].res);
  uVar1 = h2o_http2_scheduler_get_weight((h2o_http2_scheduler_openref_t *)&req[-1].upgrade.len);
  iVar3 = sprintf(__s,"%u:%u",(ulong)uVar2,(ulong)uVar1);
  hVar4 = h2o_iovec_init(__s,(long)iVar3);
  return hVar4;
}

Assistant:

static h2o_iovec_t log_priority_actual(h2o_req_t *req)
{
    h2o_http2_conn_t *conn = (void *)req->conn;
    h2o_http2_stream_t *stream = H2O_STRUCT_FROM_MEMBER(h2o_http2_stream_t, req, req);
    char *s = h2o_mem_alloc_pool(&stream->req.pool, sizeof(H2O_UINT32_LONGEST_STR ":" H2O_UINT16_LONGEST_STR));
    size_t len = (size_t)sprintf(s, "%" PRIu32 ":%" PRIu16, get_parent_stream_id(conn, stream),
                                 h2o_http2_scheduler_get_weight(&stream->_refs.scheduler));
    return h2o_iovec_init(s, len);
}